

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O1

Vector3<double> *
s2pred::GetCircumcenter<double>
          (Vector3<double> *__return_storage_ptr__,Vector3<double> *a,Vector3<double> *b,
          Vector3<double> *c,double *error)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  
  dVar8 = b->c_[0];
  dVar5 = b->c_[1];
  dVar19 = a->c_[0] - dVar8;
  dVar18 = a->c_[1] - dVar5;
  dVar9 = b->c_[2];
  dVar16 = a->c_[2] - dVar9;
  dVar10 = a->c_[0] + dVar8;
  dVar3 = a->c_[1] + dVar5;
  dVar6 = a->c_[2] + dVar9;
  dVar17 = c->c_[0];
  dVar2 = c->c_[1];
  dVar11 = dVar18 * dVar6 - dVar3 * dVar16;
  dVar13 = dVar10 * dVar16 - dVar19 * dVar6;
  dVar7 = dVar19 * dVar3 - dVar10 * dVar18;
  dVar1 = dVar7 * dVar7 + dVar13 * dVar13 + dVar11 * dVar11;
  dVar4 = c->c_[2];
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  dVar15 = dVar8 - dVar17;
  dVar14 = dVar5 - dVar2;
  dVar12 = dVar9 - dVar4;
  dVar8 = dVar8 + dVar17;
  dVar5 = dVar5 + dVar2;
  dVar9 = dVar9 + dVar4;
  dVar17 = dVar16 * dVar16 + dVar18 * dVar18 + dVar19 * dVar19;
  if (dVar17 < 0.0) {
    dVar17 = sqrt(dVar17);
  }
  else {
    dVar17 = SQRT(dVar17);
  }
  dVar4 = dVar14 * dVar9 - dVar5 * dVar12;
  dVar18 = dVar8 * dVar12 - dVar15 * dVar9;
  dVar16 = dVar15 * dVar5 - dVar8 * dVar14;
  dVar2 = dVar16 * dVar16 + dVar18 * dVar18 + dVar4 * dVar4;
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  dVar19 = dVar12 * dVar12 + dVar14 * dVar14 + dVar15 * dVar15;
  if (dVar19 < 0.0) {
    dVar19 = sqrt(dVar19);
  }
  else {
    dVar19 = SQRT(dVar19);
  }
  dVar12 = dVar6 * dVar13 - dVar3 * dVar7;
  dVar7 = dVar7 * dVar10 - dVar6 * dVar11;
  dVar6 = dVar3 * dVar11 - dVar10 * dVar13;
  dVar3 = dVar9 * dVar18 - dVar5 * dVar16;
  dVar9 = dVar16 * dVar8 - dVar9 * dVar4;
  dVar8 = dVar5 * dVar4 - dVar8 * dVar18;
  *error = (dVar1 + dVar2) * 2.732694335895138e-30 +
           ((dVar17 + dVar19) * 8.881784197001252e-16 + 6.391467286720804e-15) * dVar1 * dVar2 +
           1.8669045833583425e-60;
  __return_storage_ptr__->c_[0] = dVar7 * dVar8 - dVar6 * dVar9;
  __return_storage_ptr__->c_[1] = dVar6 * dVar3 - dVar8 * dVar12;
  __return_storage_ptr__->c_[2] = dVar9 * dVar12 - dVar3 * dVar7;
  return __return_storage_ptr__;
}

Assistant:

Vector3<T> GetCircumcenter(const Vector3<T>& a, const Vector3<T>& b,
                           const Vector3<T>& c, T* error) {
  constexpr T T_ERR = rounding_epsilon<T>();

  // We compute the circumcenter using the intersection of the perpendicular
  // bisectors of AB and BC.  The formula is essentially
  //
  //    Z = ((A x B) x (A + B)) x ((B x C) x (B + C)),
  //
  // except that we compute the cross product (A x B) as (A - B) x (A + B)
  // (and similarly for B x C) since this is much more stable when the inputs
  // are unit vectors.
  Vector3<T> ab_diff = a - b, ab_sum = a + b;
  Vector3<T> bc_diff = b - c, bc_sum = b + c;
  Vector3<T> nab = ab_diff.CrossProd(ab_sum);
  T nab_len = nab.Norm();
  T ab_len = ab_diff.Norm();
  Vector3<T> nbc = bc_diff.CrossProd(bc_sum);
  T nbc_len = nbc.Norm();
  T bc_len = bc_diff.Norm();
  Vector3<T> mab = nab.CrossProd(ab_sum);
  Vector3<T> mbc = nbc.CrossProd(bc_sum);
  *error = (((16 + 24 * sqrt(3)) * T_ERR +
                8 * DBL_ERR * (ab_len + bc_len)) * nab_len * nbc_len +
               128 * sqrt(3) * DBL_ERR * T_ERR * (nab_len + nbc_len) +
               3 * 4096 * DBL_ERR * DBL_ERR * T_ERR * T_ERR);
  return mab.CrossProd(mbc);
}